

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack26_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar21 [32];
  
  auVar5 = _DAT_00190730;
  auVar12 = *(undefined1 (*) [16])(in + 1);
  auVar15 = vpmovsxbd_avx(ZEXT416(0x18120c06));
  uVar3 = *in;
  uVar1 = *(ulong *)(in + 6);
  auVar24._8_8_ = 0x3ff000003fffc00;
  auVar24._0_8_ = 0x3ff000003fffc00;
  uVar2 = *(ulong *)(in + 9);
  auVar6 = vpmovsxbd_avx512vl(ZEXT416(0x4010100));
  auVar7 = vpbroadcastq_avx512vl(ZEXT816(0x800000002));
  auVar8 = vpmovsxbd_avx512vl(ZEXT416(0x5010401));
  auVar9 = vpbroadcastq_avx512vl(ZEXT816(0x140000000e));
  auVar10 = vpbroadcastq_avx512vl(ZEXT816(0x3f0000003ffc000));
  *out = uVar3 & 0x3ffffff;
  auVar14 = vpsllvd_avx2(auVar12,auVar15);
  auVar16 = valignd_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar12),7);
  auVar12 = vpand_avx(auVar14,auVar5);
  auVar22._8_8_ = 0x100000000a;
  auVar22._0_8_ = 0x100000000a;
  auVar17 = vpbroadcastd_avx512vl();
  auVar16 = vpblendd_avx2(auVar16,ZEXT432(uVar3),1);
  auVar19 = vpmovsxbd_avx2(ZEXT816(0xe040403020100));
  auVar18 = vpbroadcastd_avx512vl();
  uVar3 = in[8];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar14 = vpsllvd_avx2(auVar11,auVar22);
  auVar14 = vpand_avx(auVar14,auVar24);
  auVar27._0_8_ = auVar14._0_8_;
  auVar27._8_8_ = auVar27._0_8_;
  auVar27._16_8_ = auVar27._0_8_;
  auVar27._24_8_ = auVar27._0_8_;
  auVar16 = vpermt2d_avx512vl(auVar16,auVar19,auVar17);
  uVar25 = (undefined4)uVar1;
  auVar17._4_4_ = uVar25;
  auVar17._0_4_ = uVar25;
  auVar17._8_4_ = uVar25;
  auVar17._12_4_ = uVar25;
  auVar17._16_4_ = uVar25;
  auVar17._20_4_ = uVar25;
  auVar17._24_4_ = uVar25;
  auVar17._28_4_ = uVar25;
  auVar16 = vpblendd_avx2(auVar16,auVar17,0x80);
  auVar17 = vpmovsxbd_avx2(ZEXT816(0x10161c02080e141a));
  auVar23 = vpsrlvd_avx2(auVar16,auVar17);
  auVar20._8_4_ = 0x3ffffff;
  auVar20._0_8_ = 0x3ffffff03ffffff;
  auVar20._12_4_ = 0x3ffffff;
  auVar21._16_4_ = 0x3ffffff;
  auVar21._0_16_ = auVar20;
  auVar21._20_4_ = 0x3ffffff;
  auVar21._24_4_ = 0x3ffffff;
  auVar21._28_4_ = 0x3ffffff;
  auVar16 = vpblendd_avx2(ZEXT1632(auVar12),auVar21,0x10);
  auVar16 = vpblendd_avx2(auVar16,auVar18,0x20);
  auVar18 = vpblendd_avx2(auVar16,auVar27,0xc0);
  auVar16 = vpand_avx2(auVar23,auVar21);
  auVar18 = vpor_avx2(auVar23,auVar18);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x181e040a));
  auVar16 = vpblendd_avx2(auVar18,auVar16,0x10);
  auVar12 = vpshufd_avx(auVar11,0x55);
  auVar26._8_8_ = 0x3ffff0003fffffc;
  auVar26._0_8_ = 0x3ffff0003fffffc;
  auVar12 = vpinsrd_avx(auVar12,uVar3,1);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar2;
  auVar11 = vpsllvd_avx512vl(auVar29,auVar7);
  *(undefined1 (*) [32])(out + 1) = auVar16;
  auVar12 = vpermt2d_avx512vl(auVar12,auVar6,auVar29);
  auVar14 = vpinsrd_avx(auVar20,(uVar3 & 0xf) << 0x16,0);
  uVar1 = *(ulong *)(in + 0xb);
  auVar13 = vpsrlvd_avx2(auVar12,auVar4);
  auVar12 = vpand_avx(auVar11,auVar26);
  auVar12 = vpunpcklqdq_avx(auVar14,auVar12);
  auVar14 = vpor_avx(auVar13,auVar12);
  auVar12 = vpand_avx(auVar13,auVar20);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1;
  auVar13 = vpermt2d_avx512vl(auVar30,auVar8,auVar31);
  auVar11 = vpsllvd_avx512vl(auVar31,auVar9);
  auVar12 = vpblendd_avx2(auVar14,auVar12,2);
  auVar28._8_8_ = 0xc00000012;
  auVar28._0_8_ = 0xc00000012;
  *(undefined1 (*) [16])(out + 9) = auVar12;
  auVar12 = vpsrlvd_avx2(auVar13,auVar28);
  auVar14 = vpternlogd_avx512vl(auVar11,auVar12,auVar10,0xec);
  auVar12 = *(undefined1 (*) [16])(in + 0xe);
  *(long *)(out + 0xd) = auVar14._0_8_;
  out[0xf] = (uint)(uVar1 >> 0x26);
  uVar3 = in[0xd];
  uVar1 = *(ulong *)(in + 0x13);
  out[0x10] = uVar3 & 0x3ffffff;
  auVar14 = vpsllvd_avx2(auVar12,auVar15);
  auVar16 = valignd_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar12),7);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar1;
  auVar15 = vpsllvd_avx512vl(auVar32,auVar22);
  auVar12 = vpand_avx(auVar14,auVar5);
  auVar14 = vpand_avx(auVar15,auVar24);
  auVar23._0_8_ = auVar14._0_8_;
  auVar23._8_8_ = auVar23._0_8_;
  auVar23._16_8_ = auVar23._0_8_;
  auVar23._24_8_ = auVar23._0_8_;
  auVar18 = vpbroadcastd_avx512vl();
  auVar16 = vpblendd_avx2(auVar16,ZEXT432(uVar3),1);
  auVar16 = vpermt2d_avx512vl(auVar16,auVar19,auVar18);
  auVar19 = vpbroadcastd_avx512vl(auVar32);
  auVar16 = vpblendd_avx2(auVar16,auVar19,0x80);
  auVar19 = vpblendd_avx2(ZEXT1632(auVar12),auVar21,0x10);
  uVar2 = *(ulong *)(in + 0x16);
  auVar17 = vpsrlvd_avx2(auVar16,auVar17);
  auVar16 = vpbroadcastd_avx512vl();
  uVar3 = in[0x15];
  auVar16 = vpblendd_avx2(auVar19,auVar16,0x20);
  auVar16 = vpblendd_avx2(auVar16,auVar23,0xc0);
  auVar19 = vpor_avx2(auVar17,auVar16);
  auVar16 = vpand_avx2(auVar17,auVar21);
  auVar16 = vpblendd_avx2(auVar19,auVar16,0x10);
  *(undefined1 (*) [32])(out + 0x11) = auVar16;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar12 = vpshufd_avx512vl(auVar15,0x55);
  auVar12 = vpinsrd_avx(auVar12,uVar3,1);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar15 = vpermt2d_avx512vl(auVar12,auVar6,auVar13);
  auVar12 = vpsllvd_avx512vl(auVar13,auVar7);
  auVar14 = vpinsrd_avx(auVar20,(uVar3 & 0xf) << 0x16,0);
  uVar1 = *(ulong *)(in + 0x18);
  auVar12 = vpand_avx(auVar26,auVar12);
  auVar12 = vpunpcklqdq_avx(auVar14,auVar12);
  auVar15 = vpsrlvd_avx2(auVar15,auVar4);
  auVar14 = vpor_avx(auVar15,auVar12);
  auVar12 = vpand_avx(auVar15,auVar20);
  auVar12 = vpblendd_avx2(auVar14,auVar12,2);
  *(undefined1 (*) [16])(out + 0x19) = auVar12;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar12 = vpermt2d_avx512vl(auVar12,auVar8,auVar14);
  auVar14 = vpsllvd_avx512vl(auVar14,auVar9);
  auVar12 = vpsrlvd_avx2(auVar12,auVar28);
  auVar12 = vpternlogd_avx512vl(auVar14,auVar12,auVar10,0xec);
  *(long *)(out + 0x1d) = auVar12._0_8_;
  out[0x1f] = (uint)(uVar1 >> 0x26);
  return in + 0x1a;
}

Assistant:

const uint32_t *__fastunpack26_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;

  return in;
}